

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int pludecomp(double *A,int N,int *ipiv)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  uVar3 = (ulong)(uint)N;
  if (0 < N) {
    uVar4 = 0;
    do {
      ipiv[uVar4] = (int)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  if (1 < N) {
    pdVar10 = A + uVar3;
    uVar12 = 1;
    uVar4 = 0;
    uVar6 = uVar3;
    pdVar13 = A;
    pdVar14 = A;
    do {
      uVar9 = (ulong)(uint)((int)uVar4 * N);
      uVar1 = uVar4 + 1;
      dVar16 = ABS(A[uVar4 + uVar9]);
      uVar8 = uVar4 & 0xffffffff;
      pdVar5 = pdVar10;
      uVar11 = uVar12;
      do {
        dVar17 = ABS(*pdVar5);
        if (dVar16 < dVar17) {
          uVar8 = uVar11 & 0xffffffff;
        }
        uVar15 = -(ulong)(dVar16 < dVar17);
        dVar16 = (double)(~uVar15 & (ulong)dVar16 | (ulong)*pdVar5 & uVar15);
        uVar11 = uVar11 + 1;
        pdVar5 = pdVar5 + uVar3;
      } while (uVar3 != uVar11);
      iVar7 = (int)uVar8;
      if (uVar4 != uVar8) {
        iVar2 = ipiv[iVar7];
        ipiv[iVar7] = ipiv[uVar4];
        ipiv[uVar4] = iVar2;
        uVar11 = 0;
        do {
          dVar16 = pdVar14[uVar11];
          pdVar14[uVar11] = A[(long)(iVar7 * N) + uVar11];
          A[(long)(iVar7 * N) + uVar11] = dVar16;
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
      dVar16 = A[uVar4 + uVar9];
      pdVar5 = pdVar10;
      uVar11 = uVar12;
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        do {
          dVar17 = A[uVar4 + uVar11 * uVar3];
          A[uVar4 + uVar11 * uVar3] = dVar17 / dVar16;
          uVar8 = 1;
          do {
            pdVar5[uVar8] = pdVar13[uVar8] * -(dVar17 / dVar16) + pdVar5[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
          uVar11 = uVar11 + 1;
          pdVar5 = pdVar5 + uVar3;
        } while (uVar11 != uVar3);
      }
      uVar12 = uVar12 + 1;
      pdVar10 = pdVar10 + uVar3 + 1;
      pdVar14 = pdVar14 + uVar3;
      pdVar13 = pdVar13 + uVar3 + 1;
      uVar6 = uVar6 - 1;
      uVar4 = uVar1;
    } while (uVar1 != N - 1);
  }
  return N;
}

Assistant:

static int pludecomp(double *A,int N,int *ipiv) {
	int k,j,l,c1,c2,mind,tempi;
	double ld,mult,mval,temp;
	for(k=0;k < N;++k)
		ipiv[k] = k;
	
	for(k = 0; k < N-1; ++k) {
		//c2 = k*N;
		mval = fabs(A[k*N + k]);
		mind = k;
		for (j=k+1; j < N;++j) {
			if (mval < fabs(A[j*N + k])) {
				mval = A[j*N + k];
				mind = j;
			}
		}
		
		if ( mind != k) {
			c1 = k *N;
			c2 = mind * N;
			tempi = ipiv[mind];
			ipiv[mind] = ipiv[k];
			ipiv[k] = tempi;
			for (j = 0; j < N;j++) {
				temp = A[c1 + j];
				*(A + c1 + j) = *(A + c2 + j);
				*(A + c2 + j) = temp;
			}
		}
		c2 = k*N;
		ld = A[c2 + k];
		if (ld != 0.) {
			for (j = k+1; j < N; ++j) {
				c1 = j*N;
				mult = A[c1+k] /= ld;
				//printf("\n k %d j %d mult %lf \n",k,j,mult);
				for(l = k+1; l < N; ++l) {
					A[c1+l] -= mult * A[c2 + l];
				}
			}
		}
		
	}
	return 0;
	
}